

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_integrate(ref_metric_integrand integrand,void *state,REF_DBL *integral)

{
  uint uVar1;
  double in_RAX;
  long lVar2;
  REF_DBL value;
  double local_38;
  
  *integral = 0.0;
  lVar2 = 0;
  local_38 = in_RAX;
  do {
    uVar1 = (*integrand)(state,*(double *)((long)tq + lVar2) * 0.5 + 0.5,&local_38);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xe17,"ref_metric_integrate",(ulong)uVar1,"eval");
      return uVar1;
    }
    *integral = *(double *)((long)wq + lVar2) * 0.5 * local_38 + *integral;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0xa0);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_integrate(ref_metric_integrand integrand,
                                        void *state, REF_DBL *integral) {
  REF_INT i;
  REF_DBL t;
  REF_DBL value;
  *integral = 0.0;
  for (i = 0; i < nq; i++) {
    t = 0.5 * tq[i] + 0.5;
    RSS(integrand(state, t, &value), "eval");
    *integral += 0.5 * wq[i] * value;
  }

  return REF_SUCCESS;
}